

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdLoad.c
# Opt level: O2

void Load_Init(Abc_Frame_t *pAbc)

{
  return;
}

Assistant:

void Load_Init( Abc_Frame_t * pAbc )
{
    Vec_Ptr_t * vFileNames;
    char * pName, * pStop;
    int i;
    vFileNames = CmdCollectFileNames();
    if ( vFileNames == NULL )
        return;
    Vec_PtrForEachEntry( char *, vFileNames, pName, i )
    {
        if ( strncmp( pName, "abccmd_", 7 ) )
            continue;
        // get the command name
//        pName[6] = '!';
        pStop = strstr( pName + 7, "." );
        if ( pStop )
            *pStop = 0;
        // add the command
        Cmd_CommandAdd( pAbc, "ZZ", pName+7, CmdCommandLoad, 0 );
//        printf( "Loaded command \"%s\"\n", pName+7 );
    }
    Vec_PtrFreeFree( vFileNames );
}